

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metablock.c
# Opt level: O0

void BrotliBuildMetaBlockGreedy
               (MemoryManager *m,uint8_t *ringbuffer,size_t pos,size_t mask,uint8_t prev_byte,
               uint8_t prev_byte2,ContextLut literal_context_lut,size_t num_contexts,
               uint32_t *static_context_map,Command_conflict *commands,size_t n_commands,
               BlockSplitFromDecoder *literals_block_splits,size_t *current_block_literals,
               BlockSplitFromDecoder *cmds_block_splits,size_t *current_block_cmds,
               MetaBlockSplit *mb)

{
  byte bVar1;
  undefined2 uVar4;
  undefined2 uVar5;
  ulong uVar2;
  undefined2 uVar6;
  ulong uVar3;
  undefined2 uVar7;
  Command_conflict *pCVar8;
  uint8_t prev_byte2_local;
  uint8_t prev_byte_local;
  size_t mask_local;
  size_t pos_local;
  uint8_t *ringbuffer_local;
  MemoryManager *m_local;
  size_t context_1;
  ulong uStack_640;
  uint8_t literal_1;
  size_t j_1;
  Command_conflict cmd_1;
  size_t i_1;
  size_t num_literals_1;
  BlockSplitterDistance dist_blocks_1;
  BlockSplitterCommand cmd_blocks_1;
  anon_union_336_2_32013c24 lit_blocks_1;
  byte local_372;
  byte local_371;
  size_t local_368;
  size_t context;
  ulong uStack_340;
  uint8_t literal;
  size_t j;
  Command_conflict cmd;
  size_t i;
  size_t num_literals;
  BlockSplitterDistance dist_blocks;
  BlockSplitterCommand cmd_blocks;
  anon_union_336_2_32013c24 lit_blocks;
  size_t local_68;
  
  if (num_contexts == 1) {
    i = 0;
    cmd.dist_extra_ = 0;
    cmd.cmd_prefix_ = 0;
    cmd.dist_prefix_ = 0;
    for (; (ulong)cmd._8_8_ < n_commands; cmd._8_8_ = cmd._8_8_ + 1) {
      i = commands[cmd._8_8_].insert_len_ + i;
    }
    InitBlockSplitterLiteral
              (m,(BlockSplitterLiteral *)&cmd_blocks.merge_last_count_,0x100,0x200,400.0,i,
               &mb->literal_split,&mb->literal_histograms,&mb->literal_histograms_size);
    if (literals_block_splits != (BlockSplitFromDecoder *)0x0) {
      BrotliSplitBlockLiteralsFromStored
                (m,commands,n_commands,pos,mask,(BlockSplit *)lit_blocks.plain.num_types_,
                 literals_block_splits,current_block_literals);
    }
    InitBlockSplitterCommand
              (m,(BlockSplitterCommand *)&dist_blocks.merge_last_count_,0x2c0,0x400,500.0,n_commands
               ,&mb->command_split,&mb->command_histograms,&mb->command_histograms_size);
    InitBlockSplitterDistance
              (m,(BlockSplitterDistance *)&num_literals,0x40,0x200,100.0,n_commands,
               &mb->distance_split,&mb->distance_histograms,&mb->distance_histograms_size);
    if (cmds_block_splits != (BlockSplitFromDecoder *)0x0) {
      cmd_blocks.num_blocks_ = 0;
      BrotliSplitBlockCommandsFromStored
                (m,commands,n_commands,pos,mask,(BlockSplit *)cmd_blocks.num_types_,
                 cmds_block_splits,current_block_cmds);
    }
    cmd.dist_extra_ = 0;
    cmd.cmd_prefix_ = 0;
    cmd.dist_prefix_ = 0;
    local_68 = pos;
    for (; (ulong)cmd._8_8_ < n_commands; cmd._8_8_ = cmd._8_8_ + 1) {
      pCVar8 = commands + cmd._8_8_;
      uVar2._0_4_ = pCVar8->insert_len_;
      uVar2._4_4_ = pCVar8->copy_len_;
      uVar4 = pCVar8->cmd_prefix_;
      uVar6 = pCVar8->dist_prefix_;
      if (cmds_block_splits == (BlockSplitFromDecoder *)0x0) {
        BlockSplitterAddSymbolCommand
                  ((BlockSplitterCommand *)&dist_blocks.merge_last_count_,(ulong)(ushort)uVar4);
      }
      else {
        BlockSplitterStoredAddSymbolCommand
                  ((BlockSplitterCommand *)&dist_blocks.merge_last_count_,(ulong)(ushort)uVar4);
      }
      for (uStack_340 = uVar2 & 0xffffffff; uStack_340 != 0; uStack_340 = uStack_340 - 1) {
        if (literals_block_splits == (BlockSplitFromDecoder *)0x0) {
          BlockSplitterAddSymbolLiteral
                    ((BlockSplitterLiteral *)&cmd_blocks.merge_last_count_,
                     (ulong)ringbuffer[local_68 & mask]);
        }
        else {
          BlockSplitterStoredAddSymbolLiteral
                    ((BlockSplitterLiteral *)&cmd_blocks.merge_last_count_,
                     (ulong)ringbuffer[local_68 & mask]);
        }
        local_68 = local_68 + 1;
      }
      local_68 = (uVar2._4_4_ & 0x1ffffff) + local_68;
      if (((uVar2 & 0x1ffffff00000000) != 0) && (0x7f < (ushort)uVar4)) {
        BlockSplitterAddSymbolDistance
                  ((BlockSplitterDistance *)&num_literals,(long)(int)((ushort)uVar6 & 0x3ff));
      }
    }
    if (literals_block_splits == (BlockSplitFromDecoder *)0x0) {
      BlockSplitterFinishBlockLiteral((BlockSplitterLiteral *)&cmd_blocks.merge_last_count_,1);
    }
    else {
      BlockSplitterStoredFinishBlockLiteral((BlockSplitterLiteral *)&cmd_blocks.merge_last_count_,1)
      ;
    }
    if (cmds_block_splits == (BlockSplitFromDecoder *)0x0) {
      BlockSplitterFinishBlockCommand((BlockSplitterCommand *)&dist_blocks.merge_last_count_,1);
    }
    else {
      BlockSplitterStoredFinishBlockCommand
                ((BlockSplitterCommand *)&dist_blocks.merge_last_count_,1);
    }
    BlockSplitterFinishBlockDistance((BlockSplitterDistance *)&num_literals,1);
  }
  else {
    i_1 = 0;
    cmd_1.dist_extra_ = 0;
    cmd_1.cmd_prefix_ = 0;
    cmd_1.dist_prefix_ = 0;
    for (; (ulong)cmd_1._8_8_ < n_commands; cmd_1._8_8_ = cmd_1._8_8_ + 1) {
      i_1 = commands[cmd_1._8_8_].insert_len_ + i_1;
    }
    if (num_contexts == 1) {
      InitBlockSplitterLiteral
                (m,(BlockSplitterLiteral *)&cmd_blocks_1.merge_last_count_,0x100,0x200,400.0,i_1,
                 &mb->literal_split,&mb->literal_histograms,&mb->literal_histograms_size);
    }
    else {
      InitContextBlockSplitter
                (m,(ContextBlockSplitter *)&cmd_blocks_1.merge_last_count_,0x100,num_contexts,0x200,
                 400.0,i_1,&mb->literal_split,&mb->literal_histograms,&mb->literal_histograms_size);
    }
    if (literals_block_splits != (BlockSplitFromDecoder *)0x0) {
      if (num_contexts == 1) {
        BrotliSplitBlockLiteralsFromStored
                  (m,commands,n_commands,pos,mask,(BlockSplit *)lit_blocks_1.plain.num_types_,
                   literals_block_splits,current_block_literals);
      }
      else {
        BrotliSplitBlockLiteralsFromStored
                  (m,commands,n_commands,pos,mask,(BlockSplit *)lit_blocks_1.plain.histograms_,
                   literals_block_splits,current_block_literals);
      }
    }
    InitBlockSplitterCommand
              (m,(BlockSplitterCommand *)&dist_blocks_1.merge_last_count_,0x2c0,0x400,500.0,
               n_commands,&mb->command_split,&mb->command_histograms,&mb->command_histograms_size);
    InitBlockSplitterDistance
              (m,(BlockSplitterDistance *)&num_literals_1,0x40,0x200,100.0,n_commands,
               &mb->distance_split,&mb->distance_histograms,&mb->distance_histograms_size);
    if (cmds_block_splits != (BlockSplitFromDecoder *)0x0) {
      cmd_blocks_1.num_blocks_ = 0;
      BrotliSplitBlockCommandsFromStored
                (m,commands,n_commands,pos,mask,(BlockSplit *)cmd_blocks_1.num_types_,
                 cmds_block_splits,current_block_cmds);
    }
    cmd_1.dist_extra_ = 0;
    cmd_1.cmd_prefix_ = 0;
    cmd_1.dist_prefix_ = 0;
    local_372 = prev_byte2;
    local_371 = prev_byte;
    local_368 = pos;
    for (; (ulong)cmd_1._8_8_ < n_commands; cmd_1._8_8_ = cmd_1._8_8_ + 1) {
      pCVar8 = commands + cmd_1._8_8_;
      uVar3._0_4_ = pCVar8->insert_len_;
      uVar3._4_4_ = pCVar8->copy_len_;
      uVar5 = pCVar8->cmd_prefix_;
      uVar7 = pCVar8->dist_prefix_;
      if (cmds_block_splits == (BlockSplitFromDecoder *)0x0) {
        BlockSplitterAddSymbolCommand
                  ((BlockSplitterCommand *)&dist_blocks_1.merge_last_count_,(ulong)(ushort)uVar5);
      }
      else {
        BlockSplitterStoredAddSymbolCommand
                  ((BlockSplitterCommand *)&dist_blocks_1.merge_last_count_,(ulong)(ushort)uVar5);
      }
      for (uStack_640 = uVar3 & 0xffffffff; uStack_640 != 0; uStack_640 = uStack_640 - 1) {
        bVar1 = ringbuffer[local_368 & mask];
        if (num_contexts == 1) {
          if (literals_block_splits == (BlockSplitFromDecoder *)0x0) {
            BlockSplitterAddSymbolLiteral
                      ((BlockSplitterLiteral *)&cmd_blocks_1.merge_last_count_,(ulong)bVar1);
          }
          else {
            BlockSplitterStoredAddSymbolLiteral
                      ((BlockSplitterLiteral *)&cmd_blocks_1.merge_last_count_,(ulong)bVar1);
          }
        }
        else if (literals_block_splits == (BlockSplitFromDecoder *)0x0) {
          ContextBlockSplitterAddSymbol
                    ((ContextBlockSplitter *)&cmd_blocks_1.merge_last_count_,m,(ulong)bVar1,
                     (ulong)static_context_map
                            [(int)(uint)(literal_context_lut[local_371] |
                                        literal_context_lut[(ulong)local_372 + 0x100])]);
        }
        else {
          ContextBlockSplitterStoredAddSymbolLiterals
                    ((ContextBlockSplitter *)&cmd_blocks_1.merge_last_count_,m,(ulong)bVar1,
                     (ulong)static_context_map
                            [(int)(uint)(literal_context_lut[local_371] |
                                        literal_context_lut[(ulong)local_372 + 0x100])]);
        }
        local_372 = local_371;
        local_368 = local_368 + 1;
        local_371 = bVar1;
      }
      local_368 = (uVar3._4_4_ & 0x1ffffff) + local_368;
      if ((uVar3 & 0x1ffffff00000000) != 0) {
        local_372 = ringbuffer[local_368 - 2 & mask];
        local_371 = ringbuffer[local_368 - 1 & mask];
        if (0x7f < (ushort)uVar5) {
          BlockSplitterAddSymbolDistance
                    ((BlockSplitterDistance *)&num_literals_1,(long)(int)((ushort)uVar7 & 0x3ff));
        }
      }
    }
    if (num_contexts == 1) {
      if (literals_block_splits == (BlockSplitFromDecoder *)0x0) {
        BlockSplitterFinishBlockLiteral((BlockSplitterLiteral *)&cmd_blocks_1.merge_last_count_,1);
      }
      else {
        BlockSplitterStoredFinishBlockLiteral
                  ((BlockSplitterLiteral *)&cmd_blocks_1.merge_last_count_,1);
      }
    }
    else if (literals_block_splits == (BlockSplitFromDecoder *)0x0) {
      ContextBlockSplitterFinishBlock((ContextBlockSplitter *)&cmd_blocks_1.merge_last_count_,m,1);
    }
    else {
      ContextBlockSplitterStoredFinishBlockLiterals
                ((ContextBlockSplitter *)&cmd_blocks_1.merge_last_count_,m,1);
    }
    if (cmds_block_splits == (BlockSplitFromDecoder *)0x0) {
      BlockSplitterFinishBlockCommand((BlockSplitterCommand *)&dist_blocks_1.merge_last_count_,1);
    }
    else {
      BlockSplitterStoredFinishBlockCommand
                ((BlockSplitterCommand *)&dist_blocks_1.merge_last_count_,1);
    }
    BlockSplitterFinishBlockDistance((BlockSplitterDistance *)&num_literals_1,1);
    if (1 < num_contexts) {
      MapStaticContexts(m,num_contexts,static_context_map,mb);
    }
  }
  return;
}

Assistant:

void BrotliBuildMetaBlockGreedy(MemoryManager* m,
                                const uint8_t* ringbuffer,
                                size_t pos,
                                size_t mask,
                                uint8_t prev_byte,
                                uint8_t prev_byte2,
                                ContextLut literal_context_lut,
                                size_t num_contexts,
                                const uint32_t* static_context_map,
                                const Command* commands,
                                size_t n_commands,
                                const BlockSplitFromDecoder* literals_block_splits,
                                size_t* current_block_literals,
                                const BlockSplitFromDecoder* cmds_block_splits,
                                size_t* current_block_cmds,
                                MetaBlockSplit* mb) {
  if (num_contexts == 1) {
    BrotliBuildMetaBlockGreedyInternal(m, ringbuffer, pos, mask, prev_byte,
        prev_byte2, literal_context_lut, 1, NULL, commands, n_commands,
        literals_block_splits, current_block_literals,
        cmds_block_splits, current_block_cmds, mb);
  } else {
    BrotliBuildMetaBlockGreedyInternal(m, ringbuffer, pos, mask, prev_byte,
        prev_byte2, literal_context_lut, num_contexts, static_context_map,
        commands, n_commands, literals_block_splits, current_block_literals,
        cmds_block_splits, current_block_cmds, mb);
  }
}